

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgDisplay * __thiscall cimg_library::CImgDisplay::set_button(CImgDisplay *this)

{
  X11_static *pXVar1;
  
  this->_button = 0;
  this->_is_event = true;
  pXVar1 = cimg::X11_attr();
  pthread_cond_broadcast((pthread_cond_t *)&pXVar1->wait_event);
  return this;
}

Assistant:

CImgDisplay& set_button() {
      _button = 0;
      _is_event = true;
#if cimg_display==1
      pthread_cond_broadcast(&cimg::X11_attr().wait_event);
#elif cimg_display==2
      SetEvent(cimg::Win32_attr().wait_event);
#endif
      return *this;
    }